

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_4e43c7::SQLiteBuildDB::getKeys
          (SQLiteBuildDB *this,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *keys_out,
          string *error_out)

{
  int iVar1;
  long lVar2;
  int __oflag;
  bool bVar3;
  sqlite3_stmt *stmt;
  undefined8 local_58;
  string local_50;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->dbMutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar1 = open(this,(char *)error_out,__oflag);
  if ((char)iVar1 == '\0') {
    bVar3 = false;
  }
  else {
    iVar1 = sqlite3_prepare_v2(this->db,"SELECT key FROM key_names;",0xffffffff,&local_58,0);
    bVar3 = iVar1 == 0;
    if (bVar3) {
      iVar1 = sqlite3_step(local_58);
      if (iVar1 == 100) {
        do {
          iVar1 = sqlite3_column_count(local_58);
          if (iVar1 != 1) {
            __assert_fail("sqlite3_column_count(stmt) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x2d5,
                          "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeys(std::vector<KeyType> &, std::string *)"
                         );
          }
          iVar1 = sqlite3_column_bytes(local_58,0);
          lVar2 = sqlite3_column_text(local_58,0);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar2,iVar1 + lVar2);
          std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::
          emplace_back<llbuild::core::KeyType>(keys_out,(KeyType *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          iVar1 = sqlite3_step(local_58);
        } while (iVar1 == 100);
      }
      sqlite3_finalize(local_58);
    }
    else {
      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_50,this);
      std::__cxx11::string::operator=((string *)error_out,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar3;
}

Assistant:

virtual bool getKeys(std::vector<KeyType>& keys_out, std::string* error_out) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    if (!open(error_out))
      return false;

    // Search for the key in the database
    int result;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(db, "SELECT key FROM key_names;",
                                -1, &stmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 1);

      auto size = sqlite3_column_bytes(stmt, 0);
      auto text = (const char*) sqlite3_column_text(stmt, 0);

      keys_out.push_back(KeyType(text, size));
    }

    sqlite3_finalize(stmt);

    return true;
  }